

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O0

Real __thiscall amrex::CoordSys::AreaLo(CoordSys *this,IntVect *point,int dir)

{
  int dir_local;
  IntVect *point_local;
  CoordSys *this_local;
  double local_18;
  
  if (dir == 0) {
    local_18 = this->dx[1] * this->dx[2];
  }
  else if (dir == 1) {
    local_18 = this->dx[0] * this->dx[2];
  }
  else if (dir == 2) {
    local_18 = this->dx[1] * this->dx[0];
  }
  else {
    local_18 = 0.0;
  }
  return local_18;
}

Assistant:

Real
CoordSys::AreaLo (const IntVect& point, int dir) const noexcept
{
    amrex::ignore_unused(point,dir);
#if (AMREX_SPACEDIM==2)
    Real xlo[AMREX_SPACEDIM];
    switch (c_sys)
    {
    case cartesian:
        switch (dir)
        {
        case 0: return dx[1];
        case 1: return dx[0];
        }
        return 0._rt; // to silent compiler warning
    case RZ:
        LoNode(point,xlo);
        switch (dir)
        {
        case 0: return Real(TWOPI)*dx[1]*xlo[0];
        case 1: return ((xlo[0]+dx[0])*(xlo[0]+dx[0])-xlo[0]*xlo[0])*static_cast<Real>(0.5*TWOPI);
        }
        return 0._rt; // to silent compiler warning
    default:
        AMREX_ASSERT(0);
    }
#endif
#if (AMREX_SPACEDIM==3)
    switch (dir)
    {
    case 0: return dx[1]*dx[2];
    case 1: return dx[0]*dx[2];
    case 2: return dx[1]*dx[0];
    }
#endif
    return 0;
}